

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O2

int ovf_write_segment_8(ovf_file *ovf_file_ptr,ovf_segment *segment,double *data,int format)

{
  int iVar1;
  undefined4 in_register_0000000c;
  int format_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (ovf_file_ptr != (ovf_file *)0x0) {
    format_local = format;
    if ((((segment != (ovf_segment *)0x0) && (segment->title != (char *)0x0)) &&
        (segment->comment != (char *)0x0)) && (data != (double *)0x0)) {
      if (format - 1U < 2) {
        format_local = 0;
      }
      else if ((4 < (uint)format) || ((0x19U >> (format & 0x1fU) & 1) == 0)) {
        fmt::v5::format<char[51],int>
                  (&local_38,(v5 *)"libovf ovf_write_segment_8: invalid format \'{}\'...",
                   (char (*) [51])&format_local,(int *)CONCAT44(in_register_0000000c,format));
        std::__cxx11::string::operator=
                  ((string *)&ovf_file_ptr->_state->message_latest,(string *)&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        return -2;
      }
      iVar1 = ovf::detail::write::segment<double>(ovf_file_ptr,segment,data,false,format_local);
      if (iVar1 == -1) {
        return -1;
      }
      std::__cxx11::string::append((char *)&ovf_file_ptr->_state->message_latest);
      return iVar1;
    }
    std::__cxx11::string::assign((char *)&ovf_file_ptr->_state->message_latest);
  }
  return -2;
}

Assistant:

int ovf_write_segment_8(struct ovf_file *ovf_file_ptr, const struct ovf_segment *segment, double *data, int format)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !check_segment(segment) )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: segment not correctly initialized";
        return OVF_ERROR;
    }

    if( !data )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid data pointer";
        return OVF_ERROR;
    }

    if( format == OVF_FORMAT_BIN8 ||
        format == OVF_FORMAT_BIN4 )
        format = OVF_FORMAT_BIN;

    if( format != OVF_FORMAT_BIN  &&
        format != OVF_FORMAT_TEXT &&
        format != OVF_FORMAT_CSV  )
    {
        ovf_file_ptr->_state->message_latest =
            fmt::format("libovf ovf_write_segment_8: invalid format \'{}\'...", format);
        return OVF_ERROR;
    }

    int retcode = ovf::detail::write::segment(ovf_file_ptr, segment, data, false, format);
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_write_segment_8 failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}